

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedmatting.cpp
# Opt level: O0

void __thiscall SharedMatting::SharedMatting(SharedMatting *this)

{
  SharedMatting *this_local;
  
  cv::Mat::Mat(&this->pImg);
  cv::Mat::Mat(&this->trimap);
  cv::Mat::Mat(&this->matte);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&this->uT);
  std::vector<Tuple,_std::allocator<Tuple>_>::vector(&this->tuples);
  std::vector<Ftuple,_std::allocator<Ftuple>_>::vector(&this->ftuples);
  this->kI = 10;
  this->kC = 5.0;
  this->kG = 4;
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::clear(&this->uT);
  std::vector<Tuple,_std::allocator<Tuple>_>::clear(&this->tuples);
  return;
}

Assistant:

SharedMatting::SharedMatting()
{
    kI = 10;
    kC = 5.0;
    kG = 4;  
    uT.clear();
    tuples.clear();

}